

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseException.h
# Opt level: O0

void __thiscall
AutoArgParse::MissingMandatoryArgException::MissingMandatoryArgException
          (MissingMandatoryArgException *this,FlagStore *flagStore)

{
  FlagStore *in_RDX;
  string local_38;
  FlagStore *local_18;
  FlagStore *flagStore_local;
  MissingMandatoryArgException *this_local;
  
  local_18 = flagStore;
  flagStore_local = (FlagStore *)this;
  makeErrorMessage_abi_cxx11_(&local_38,(MissingMandatoryArgException *)flagStore,in_RDX);
  ParseException::ParseException(&this->super_ParseException,MISSING_MANDATORY_ARG,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)&this->super_ParseException = &PTR__MissingMandatoryArgException_00123a40;
  this->flagStore = local_18;
  return;
}

Assistant:

MissingMandatoryArgException(const FlagStore& flagStore)
        : ParseException(MISSING_MANDATORY_ARG, makeErrorMessage(flagStore)),
          flagStore(flagStore) {}